

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.cpp
# Opt level: O3

int __thiscall
pg::Verifier::verify
          (Verifier *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  uint uVar1;
  uint64_t *puVar2;
  uint64_t *puVar3;
  Verifier *pVVar4;
  uint uVar5;
  uint uVar6;
  int extraout_EAX;
  int extraout_EAX_00;
  void *__s;
  void *__s_00;
  ostream *poVar7;
  runtime_error *prVar8;
  _Map_pointer ppiVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint *puVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  Game *pGVar18;
  int iVar19;
  long lVar20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __tmp;
  Game *pGVar21;
  ulong uVar22;
  bool bVar23;
  int v;
  stack<int,_std::deque<int,_std::allocator<int>_>_> st;
  int to;
  uint local_d4;
  Verifier *local_d0;
  uint local_c8;
  uint local_c4;
  undefined4 local_c0;
  undefined4 local_bc;
  undefined1 local_b8 [8];
  Game *pGStack_b0;
  int *local_a8;
  undefined1 local_98 [48];
  _Map_pointer ppiStack_68;
  _Map_pointer ppiStack_60;
  _Map_pointer ppiStack_58;
  _Map_pointer ppiStack_50;
  _label_vertex local_48;
  long local_38;
  
  local_c8 = (uint)ctx;
  local_bc = (undefined4)siglen;
  local_c0 = SUB84(sig,0);
  Game::sort(this->game,(int *)0x0);
  Game::build_in_array(this->game,false);
  pGVar18 = this->game;
  local_38 = pGVar18->n_vertices;
  uVar5 = (uint)local_38;
  local_d0 = this;
  if (0 < (int)uVar5) {
    uVar22 = 0;
    do {
      pVVar4 = local_d0;
      puVar2 = (pGVar18->solved)._bits;
      uVar12 = uVar22 >> 6;
      if ((puVar2[uVar12] >> (uVar22 & 0x3f) & 1) == 0) {
        if ((char)local_c8 != '\0') {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar8,"not every vertex is won");
          goto LAB_0014fc01;
        }
      }
      else {
        puVar3 = (pGVar18->winner)._bits;
        uVar15 = 1L << (uVar22 & 0x3f);
        uVar13 = puVar3[uVar12];
        bVar23 = (uVar13 & uVar15) == 0;
        if ((byte)((bVar23 | (byte)local_bc) & (!bVar23 | (byte)local_c0)) == 1) {
          if (((uVar13 & uVar15) != 0) == (((pGVar18->_owner)._bits[uVar12] & uVar15) == 0)) {
            uVar6 = pGVar18->_outedges[pGVar18->_firstouts[uVar22]];
            if (uVar6 != 0xffffffff) {
              puVar14 = (uint *)(pGVar18->_outedges + (long)pGVar18->_firstouts[uVar22] + 1);
              do {
                if (((puVar2[(ulong)(long)(int)uVar6 >> 6] >> ((ulong)uVar6 & 0x3f) & 1) == 0) ||
                   (((puVar3[(ulong)(long)(int)uVar6 >> 6] & 1L << ((ulong)uVar6 & 0x3f)) == 0) ==
                    ((uVar13 & uVar15) != 0))) {
                  poVar7 = local_d0->logger;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar7,"escape edge from ",0x11);
                  local_98._0_8_ = pVVar4->game;
                  local_98._8_4_ = (int)uVar22;
                  poVar7 = operator<<(poVar7,(_label_vertex *)local_98);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7," to ",4);
                  local_b8 = (undefined1  [8])pVVar4->game;
                  pGStack_b0 = (Game *)CONCAT44(pGStack_b0._4_4_,uVar6);
                  poVar7 = operator<<(poVar7,(_label_vertex *)local_b8);
                  std::endl<char,std::char_traits<char>>(poVar7);
                  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar8,"loser can escape");
                  goto LAB_0014fc01;
                }
                uVar6 = *puVar14;
                puVar14 = puVar14 + 1;
              } while (uVar6 != 0xffffffff);
            }
            this = local_d0;
            if (pGVar18->strategy[uVar22] != -1) {
              prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar8,"losing vertex has strategy");
              goto LAB_0014fc01;
            }
          }
          else {
            uVar12 = (ulong)pGVar18->strategy[uVar22];
            if (uVar12 == 0xffffffffffffffff) {
              prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar8,"winning vertex has no strategy");
LAB_0014fc01:
              __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            bVar23 = Game::has_edge(pGVar18,(int)uVar22,pGVar18->strategy[uVar22]);
            if (!bVar23) {
              prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar8,"strategy is not a valid move");
              goto LAB_0014fc01;
            }
            pGVar18 = local_d0->game;
            if ((((pGVar18->solved)._bits[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) == 0) ||
               ((((pGVar18->winner)._bits[uVar12 >> 6] & 1L << (uVar12 & 0x3f)) == 0) ==
                ((uVar13 & uVar15) != 0))) {
              prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar8,"strategy leaves dominion");
              goto LAB_0014fc01;
            }
            local_d0->n_strategies = local_d0->n_strategies + 1;
            this = local_d0;
          }
        }
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 != (uVar5 & 0x7fffffff));
  }
  uVar5 = (uint)local_38;
  lVar16 = local_38 << 0x20;
  __s = operator_new__(-(ulong)((ulong)(long)(int)uVar5 >> 0x3e != 0) | lVar16 >> 0x1e);
  __s_00 = operator_new__(-(ulong)((ulong)(long)(int)uVar5 >> 0x3d != 0) | lVar16 >> 0x1d);
  if (0 < (int)uVar5) {
    memset(__s,0xff,(ulong)(uVar5 & 0x7fffffff) * 4);
    this = local_d0;
    memset(__s_00,0,(ulong)(uVar5 & 0x7fffffff) << 3);
  }
  local_a8 = (int *)0x0;
  local_b8 = (undefined1  [8])0x0;
  pGStack_b0 = (Game *)0x0;
  local_98._0_8_ = (Game *)0x0;
  ppiStack_58 = (_Map_pointer)0x0;
  ppiStack_50 = (_Map_pointer)0x0;
  local_98._8_4_ = 0;
  local_98._12_4_ = 0;
  local_98._16_8_ = (_Map_pointer)0x0;
  local_98._24_24_ = (undefined1  [24])0x0;
  ppiStack_68 = ppiStack_58;
  ppiStack_60 = ppiStack_50;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            ((_Deque_base<int,_std::allocator<int>_> *)local_98,0);
  uVar6 = uVar5 - 1;
  local_c4 = uVar6;
  if (0 < (int)uVar5) {
    lVar16 = 0;
    do {
      uVar22 = (ulong)uVar6;
      pGVar18 = this->game;
      lVar17 = lVar16;
      local_c4 = uVar6;
      if (((pGVar18->solved)._bits[uVar6 >> 6] >> (uVar22 & 0x3f) & 1) != 0) {
        uVar13 = 1L << (uVar22 & 0x3f);
        uVar12 = (pGVar18->winner)._bits[uVar6 >> 6];
        bVar23 = (uVar12 & uVar13) == 0;
        if ((((byte)((bVar23 | (byte)local_bc) & (!bVar23 | (byte)local_c0)) == 1) &&
            (uVar5 = pGVar18->_priority[uVar22], ((uVar12 & uVar13) != 0) != (bool)((byte)uVar5 & 1)
            )) && (*(uint *)((long)__s + uVar22 * 4) != uVar5)) {
          if (ppiStack_68 == (_Map_pointer)((long)ppiStack_58 + -4)) {
            std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                      ((deque<int,std::allocator<int>> *)local_98,(int *)&local_c4);
          }
          else {
            *(uint *)ppiStack_68 = uVar6;
            ppiStack_68 = (_Map_pointer)((long)ppiStack_68 + 4);
          }
          if (ppiStack_68 != (_Map_pointer)local_98._16_8_) {
            local_c8 = uVar5 & 1;
            do {
              ppiVar9 = ppiStack_68;
              if (ppiStack_68 == ppiStack_60) {
                ppiVar9 = (_Map_pointer)(ppiStack_50[-1] + 0x80);
              }
              local_d4 = *(uint *)((long)ppiVar9 + -4);
              if (*(long *)((long)__s_00 + (long)(int)local_d4 * 8) <= lVar16) {
                lVar17 = lVar17 + 1;
                *(long *)((long)__s_00 + (long)(int)local_d4 * 8) = lVar17;
                if (pGStack_b0 == (Game *)local_a8) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)local_b8,(iterator)pGStack_b0,
                             (int *)&local_d4);
                }
                else {
                  *(uint *)pGStack_b0 = local_d4;
                  pGStack_b0 = (Game *)((long)pGStack_b0 + 4);
                }
              }
              pGVar18 = this->game;
              lVar20 = (long)(int)local_d4;
              uVar22 = *(ulong *)((long)__s_00 + lVar20 * 8);
              iVar19 = (int)uVar22;
              uVar6 = pGVar18->strategy[lVar20];
              lVar10 = (long)(int)uVar6;
              if (lVar10 == -1) {
                uVar6 = pGVar18->_outedges[pGVar18->_firstouts[lVar20]];
                if (uVar6 != 0xffffffff) {
                  puVar14 = (uint *)(pGVar18->_outedges + (long)pGVar18->_firstouts[lVar20] + 1);
                  do {
                    local_48.g = (Game *)CONCAT44(local_48.g._4_4_,uVar6);
                    lVar10 = (long)(int)uVar6;
                    if ((pGVar18->_priority[lVar10] <= (int)uVar5) &&
                       (*(uint *)((long)__s + lVar10 * 4) != uVar5)) {
                      uVar12 = *(ulong *)((long)__s_00 + lVar10 * 8);
                      if ((long)uVar12 <= lVar16) {
                        if (ppiStack_68 == (_Map_pointer)((long)ppiStack_58 + -4)) {
                          std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                                    ((deque<int,std::allocator<int>> *)local_98,(int *)&local_48);
                          goto LAB_0014fa6e;
                        }
                        *(uint *)ppiStack_68 = uVar6;
                        goto LAB_0014fae8;
                      }
                      iVar19 = (int)uVar22;
                      uVar22 = uVar22 & 0xffffffff;
                      if ((long)uVar12 < (long)iVar19) {
                        uVar22 = uVar12 & 0xffffffff;
                      }
                    }
                    iVar19 = (int)uVar22;
                    uVar6 = *puVar14;
                    puVar14 = puVar14 + 1;
                  } while (uVar6 != 0xffffffff);
                }
LAB_0014f979:
                lVar10 = (long)(int)local_d4;
                if ((long)iVar19 < *(long *)((long)__s_00 + lVar10 * 8)) {
                  *(long *)((long)__s_00 + lVar10 * 8) = (long)iVar19;
                }
                else {
                  pGVar18 = this->game;
                  uVar6 = 0xffffffff;
                  iVar19 = 0;
                  pGVar21 = pGStack_b0;
                  do {
                    if ((undefined1  [8])pGVar21 == local_b8) break;
                    uVar11 = *(uint *)((long)&pGVar21[-1].generator.i + 4);
                    pGVar21 = (Game *)((long)&pGVar21[-1].generator.i + 4);
                    uVar1 = pGVar18->_priority[(int)uVar11];
                    *(uint *)((long)__s + (long)(int)uVar11 * 4) = uVar5;
                    if ((int)uVar6 < (int)uVar1) {
                      uVar6 = uVar1;
                    }
                    iVar19 = iVar19 + 1;
                  } while (uVar11 != local_d4);
                  uVar11 = local_d4;
                  if ((iVar19 < 2) && (pGVar18->strategy[lVar10] != local_d4)) {
                    if ((pGVar18->strategy[lVar10] == 0xffffffff) &&
                       (bVar23 = Game::has_edge(pGVar18,local_d4,local_d4), uVar11 = local_d4,
                       bVar23 && (uVar6 & 1) == local_c8)) {
LAB_0014fc17:
                      poVar7 = local_d0->logger;
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar7,
                                 "\x1b[1;31mscc where loser wins\x1b[m with priority \x1b[1;34m",
                                 0x34);
                      poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar6);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[m",3);
                      pVVar4 = local_d0;
                      pGVar18 = pGStack_b0;
                      goto LAB_0014fc5d;
                    }
                  }
                  else if ((uVar6 & 1) == local_c8) goto LAB_0014fc17;
                  do {
                    pGVar21 = (Game *)((long)&pGStack_b0[-1].generator.i + 4);
                    pGVar18 = pGStack_b0 + -1;
                    pGStack_b0 = pGVar21;
                    this = local_d0;
                  } while (*(uint *)((long)&(pGVar18->generator).i + 4) != uVar11);
                }
                if (ppiStack_68 == ppiStack_60) {
                  operator_delete(ppiStack_60,0x200);
                  ppiStack_60 = (_Map_pointer)ppiStack_50[-1];
                  ppiStack_58 = ppiStack_60 + 0x40;
                  ppiStack_68 = (_Map_pointer)((long)ppiStack_60 + 0x1fc);
                  ppiStack_50 = ppiStack_50 + -1;
                }
                else {
                  ppiStack_68 = (_Map_pointer)((long)ppiStack_68 + -4);
                }
              }
              else {
                local_48.g = (Game *)CONCAT44(local_48.g._4_4_,uVar6);
                if (((int)uVar5 < pGVar18->_priority[lVar10]) ||
                   (*(uint *)((long)__s + lVar10 * 4) == uVar5)) goto LAB_0014f979;
                uVar12 = *(ulong *)((long)__s_00 + lVar10 * 8);
                if (lVar16 < (long)uVar12) {
                  if ((long)iVar19 <= (long)uVar12) {
                    uVar12 = uVar22;
                  }
                  iVar19 = (int)uVar12;
                  goto LAB_0014f979;
                }
                if (ppiStack_68 == (_Map_pointer)((long)ppiStack_58 + -4)) {
                  std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                            ((deque<int,std::allocator<int>> *)local_98,(int *)&local_48);
                }
                else {
                  *(uint *)ppiStack_68 = uVar6;
LAB_0014fae8:
                  ppiStack_68 = (_Map_pointer)((long)ppiStack_68 + 4);
                }
              }
LAB_0014fa6e:
            } while (ppiStack_68 != (_Map_pointer)local_98._16_8_);
          }
        }
      }
      uVar6 = local_c4 - 1;
      bVar23 = 0 < (int)local_c4;
      lVar16 = lVar17;
      local_c4 = uVar6;
    } while (bVar23);
  }
  operator_delete__(__s);
  operator_delete__(__s_00);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)local_98);
  iVar19 = extraout_EAX;
  if (local_b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_b8,(long)local_a8 - (long)local_b8);
    iVar19 = extraout_EAX_00;
  }
  return iVar19;
  while( true ) {
    uVar5 = *(uint *)((long)&pGVar18[-1].generator.i + 4);
    poVar7 = pVVar4->logger;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    local_48.g = pVVar4->game;
    local_48.v = uVar5;
    operator<<(poVar7,&local_48);
    pGVar18 = (Game *)((long)&pGVar18[-1].generator.i + 4);
    if (uVar5 == local_d4) break;
LAB_0014fc5d:
    if ((undefined1  [8])pGVar18 == local_b8) break;
  }
  std::endl<char,std::char_traits<char>>(local_d0->logger);
  operator_delete__(__s);
  operator_delete__(__s_00);
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar8,"loser can win");
  __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
Verifier::verify(bool fullgame, bool even, bool odd)
{
    // ensure the vertices are ordered properly
    game.ensure_sorted();
    // ensure that the arrays are built
    game.build_in_array(false);

    const int n_vertices = game.vertexcount();

    /**
     * The first loop removes all edges from "won" vertices that are not the strategy.
     * This turns each dominion into a single player game.
     * Also some trivial checks are performed.
     */
    for (int v=0; v < n_vertices; v++) {
        // (for full solutions) check whether every vertex is won
        if (!game.isSolved(v)) {
            if (fullgame) throw std::runtime_error("not every vertex is won");
            else continue;
        }

        const bool winner = game.getWinner(v) ;

        if (winner == 0 and !even) continue; // whatever
        if (winner == 1 and !odd) continue; // whatever

        if (winner == game.owner(v)) {
            // if winner, check whether the strategy stays in the dominion
            int str = game.getStrategy(v);
            if (str == -1) {
                throw std::runtime_error("winning vertex has no strategy");
            } else if (!game.has_edge(v, str)) {
                throw std::runtime_error("strategy is not a valid move");
            } else if (!game.isSolved(str) or game.getWinner(str) != winner) {
                throw std::runtime_error("strategy leaves dominion");
            }
            n_strategies++; // number of checked strategies
        } else {
            // if loser, check whether the loser can escape
            for (auto curedge = game.outs(v); *curedge != -1; curedge++) {
                int to = *curedge;
                if (!game.isSolved(to) or game.getWinner(to) != winner) {
                    logger << "escape edge from " << game.label_vertex(v) << " to " << game.label_vertex(to) << std::endl;
                    throw std::runtime_error("loser can escape");
                }
            }
            // and of course check that no strategy is set
            if (game.getStrategy(v) != -1) throw std::runtime_error("losing vertex has strategy");
        }
    }

    // Allocate datastructures for Tarjan search
    int *done = new int[n_vertices];
    int64_t *low = new int64_t[n_vertices];
    for (int i=0; i<n_vertices; i++) done[i] = -1;
    for (int i=0; i<n_vertices; i++) low[i] = 0;

    std::vector<int> res;
    std::stack<int> st;

    int64_t pre = 0;

    for (int top = n_vertices - 1; top >= 0; top--) {
        // only if a dominion
        if (!game.isSolved(top)) continue;

        int prio = game.priority(top);
        int winner = game.getWinner(top);

        // only compute SCC for a (probably) top vertex
        if (winner == 0 and !even) continue; // don't check even dominions
        if (winner == 1 and !odd) continue; // don't check odd dominions

        // only try to find an SCC where the loser wins
        if (winner == (prio&1)) continue;

        // only run the check if not yet done at priority <prio>
        if (done[top] == prio) continue;

        // set <bot> (in tarjan search) to current pre
        int64_t bot = pre;

        // start the tarjan search at vertex <top>
        st.push(top);

        while (!st.empty()) {
            int v = st.top();

            /**
             * When we see it for the first item, we assign the next number to it and add it to <res>.
             */
            if (low[v] <= bot) {
                low[v] = ++pre;
                res.push_back(v);
            }

            /**
             * Now we check all outgoing (allowed) edges.
             * If seen earlier, then update "min"
             * If new, then 'recurse'
             */
            int min = low[v];
            bool pushed = false;
            if (game.getStrategy(v) != -1) {
                int to = game.getStrategy(v);
                if (game.priority(to) > prio) {
                    // skip if to higher priority
                } else if (done[to] == prio) {
                    // skip if already found scc (done[to] set to prio)
                } else if (low[to] <= bot) {
                    // not visited, add to <st> and break!
                    st.push(to);
                    pushed = true;
                } else {
                    // visited, update min
                    if (low[to] < min) min = low[to];
                }
            } else {
                for (auto curedge = game.outs(v); *curedge != -1; curedge++) {
                    int to = *curedge;
                    // skip if to higher priority
                    if (game.priority(to) > prio) continue;
                    // skip if already found scc (done[to] set to prio)
                    if (done[to] == prio) continue;
                    // check if visited in this search
                    if (low[to] <= bot) {
                        // not visited, add to <st> and break!
                        st.push(to);
                        pushed = true;
                        break;
                    } else {
                        // visited, update min
                        if (low[to] < min) min = low[to];
                    }
                }
            }
            if (pushed) continue; // we pushed a new vertex to <st>...

            // there was no edge to a new vertex
            // check if we are the root of a SCC
            if (min < low[v]) {
                // not the root (outgoing edge to lower ranked vertex)
                low[v] = min;
                st.pop();
                continue;
            }

            /**
             * We're the root!
             * Now we need to figure out if we have cycles with p...
             * Also, mark every vertex in the SCC as "done @ search p"
             */
            int max_prio = -1;
            int scc_size = 0;

            for (auto it=res.rbegin(); it!=res.rend(); it++) {
                int n = *it;
                if (game.priority(n) > max_prio) max_prio = game.priority(n);
                scc_size++;
                done[n] = prio; // mark as done at prio
                if (n == v) break;
            }

            bool cycles = scc_size > 1 or game.getStrategy(v) == v or
                (game.getStrategy(v) == -1 and game.has_edge(v, v));

            if (cycles && (max_prio&1) == (prio&1)) {
                /**
                 * Found! Report.
                 */
                logger << "\033[1;31mscc where loser wins\033[m with priority \033[1;34m" << max_prio << "\033[m";
                for (auto it=res.rbegin(); it!=res.rend(); it++) {
                    int n = *it;
                    logger << " " << game.label_vertex(n);
                    if (n == v) break;
                }
                logger << std::endl;
                delete[] done;
                delete[] low;

                throw std::runtime_error("loser can win");
            }

            /**
             * Not found! Continue.
             */
            for (;;) {
                int n = res.back();
                res.pop_back();
                if (n == v) break;
            }
            st.pop();
        }
    }

    delete[] done;
    delete[] low;
}